

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O1

void __thiscall
rpn::CommandCallExpression::Evaluate(CommandCallExpression *this,EvaluationContext *context)

{
  size_t sVar1;
  pointer puVar2;
  results_iterator argsEnd;
  pointer pcVar3;
  long lVar4;
  long lVar5;
  
  sVar1 = this->arity;
  if (sVar1 == 0) {
    lVar4 = 0;
  }
  else {
    puVar2 = (context->resultsCount).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar5 = 0;
    lVar4 = 0;
    do {
      lVar4 = lVar4 + puVar2[lVar5 + -1];
      lVar5 = lVar5 + -1;
    } while (-lVar5 != sVar1);
    (context->resultsCount).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2 + -sVar1;
  }
  argsEnd._M_current =
       (context->results).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pcVar3 = (context->commandContext).result._M_dataplus._M_p;
  (context->commandContext).result._M_string_length = 0;
  *pcVar3 = '\0';
  CallCommand(this,argsEnd._M_current + -lVar4,argsEnd,&context->commandContext);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&context->results,(iterator)(argsEnd._M_current + -lVar4),(iterator)argsEnd._M_current)
  ;
  return;
}

Assistant:

void Evaluate(EvaluationContext& context) const final
    {
        const auto evaluatedArity = EvaluateArity(context.resultsCount);
        auto argsEnd = std::end(context.results);
        auto argsBegin = argsEnd - evaluatedArity;

        context.commandContext.result.clear();
        CallCommand(argsBegin, argsEnd, context.commandContext);

        context.results.erase(argsBegin, argsEnd);
    }